

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

bool __thiscall
crnlib::mipmapped_texture::read_dds_internal
          (mipmapped_texture *this,data_stream_serializer *serializer)

{
  pixel_format pVar1;
  element *peVar2;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  component_flags cVar7;
  uint uVar8;
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar9;
  byte *pbVar10;
  undefined8 extraout_RAX;
  dxt_image *this_00;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 uVar11;
  uint uVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  vector<crnlib::mip_level_*> *this_01;
  char *pcVar18;
  uint uVar19;
  color_quad<unsigned_char,_int> *pcVar20;
  uint uVar21;
  uint i;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  bool bVar27;
  color_quad_u8 q;
  vector<unsigned_char> load_buf;
  uint8 hdr [4];
  uint mask_size [4];
  uint mask_ofs [4];
  DDSURFACEDESC2 desc;
  uint local_178;
  undefined1 local_170 [2];
  undefined1 auStack_16e [6];
  dynamic_string *local_168;
  uint local_15c;
  uchar *local_158;
  undefined8 uStack_150;
  mipmapped_texture *local_148;
  uint local_13c;
  ulong local_138;
  data_stream_serializer *local_130;
  ulong local_128;
  ulong local_120;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_118;
  uint local_110;
  int local_10c;
  uint local_108 [6];
  ulong local_f0;
  face_vec *local_e8;
  mip_level *local_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  ulong local_c8;
  ulong local_c0;
  long local_b8;
  int local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_94;
  uint local_60;
  int local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  byte local_44;
  byte local_42;
  uint local_40;
  undefined7 uVar12;
  
  clear(this);
  local_168 = &this->m_last_error;
  dynamic_string::set(local_168,"Not a DDS file",0xffffffff);
  local_130 = serializer;
  iVar5 = (*serializer->m_pStream->_vptr_data_stream[4])(serializer->m_pStream,&local_10c,4);
  if ((iVar5 != 4) || (local_10c != 0x20534444)) goto LAB_0012dd0f;
  iVar5 = (*local_130->m_pStream->_vptr_data_stream[4])(local_130->m_pStream,&local_ac,0x7c);
  bVar15 = 0;
  if ((iVar5 != 0x7c) || (local_ac != 0x7c)) goto LAB_0012dd11;
  if (0xffffdfff < local_a0 - 0x2001 && 0xffffdfff < local_a4 - 0x2001) {
    this->m_width = local_a0;
    this->m_height = local_a4;
    uVar24 = 1;
    local_15c = 1;
    if ((((local_a8 & 0x20000) == 0) || (local_15c = 1, (local_94 != 0 & local_42 >> 6) != 1)) ||
       (uVar6 = utils::compute_max_mips(local_a0,local_a4), local_15c = local_94, local_94 <= uVar6)
       ) {
      if ((local_44 & 8) == 0) {
LAB_0012ddd9:
        if ((local_60 & 0x20) == 0) {
          if ((local_60 & 4) == 0) {
            if (0x18 < local_58 - 8 || (local_58 & 7) != 0) {
              pcVar18 = "Unsupported bit count";
              goto LAB_0012de58;
            }
            if ((local_60 & 0x40) == 0) {
              if ((local_60 & 1) == 0) {
                if ((local_60 >> 0x11 & 1) != 0) goto LAB_0012e00a;
                if ((local_60 & 2) == 0) {
                  pcVar18 = "Unsupported format";
                  goto LAB_0012de58;
                }
              }
              else if ((local_60 >> 0x11 & 1) != 0) {
LAB_0012e016:
                this->m_format = PIXEL_FMT_A8L8;
                goto LAB_0012e116;
              }
              this->m_format = PIXEL_FMT_A8;
            }
            else if ((local_60 >> 0x11 & 1) == 0) {
              if ((local_60 & 1) == 0) {
                this->m_format = PIXEL_FMT_R8G8B8;
              }
              else {
                this->m_format = PIXEL_FMT_A8R8G8B8;
              }
            }
            else {
              if ((local_60 & 1) != 0) goto LAB_0012e016;
LAB_0012e00a:
              this->m_format = PIXEL_FMT_L8;
            }
LAB_0012e116:
            local_178 = 0xffffffff;
          }
          else if (local_5c < 0x33545844) {
            if (local_5c < 0x32435445) {
              if (local_5c == 0x31435445) {
                this->m_format = PIXEL_FMT_ETC1;
                local_178 = 7;
              }
              else if (local_5c == 0x31495441) {
                this->m_format = PIXEL_FMT_DXT5A;
                local_178 = 4;
              }
              else {
                if (local_5c != 0x31545844) goto LAB_0012e0c7;
                this->m_format = PIXEL_FMT_DXT1;
                local_178 = 0;
              }
            }
            else if (local_5c == 0x32435445) {
              this->m_format = PIXEL_FMT_ETC2;
              local_178 = 8;
            }
            else {
              if (local_5c != 0x32495441) {
                if (local_5c == 0x32545844) goto LAB_0012dfaa;
LAB_0012e0c7:
                dynamic_string::dynamic_string
                          ((dynamic_string *)&local_158,cVarArg,
                           "Unsupported DDS FOURCC format: 0x%08X");
                pcVar18 = "";
                if (uStack_150 != (char *)0x0) {
                  pcVar18 = uStack_150;
                }
                dynamic_string::set(local_168,pcVar18,0xffffffff);
                dynamic_string::~dynamic_string((dynamic_string *)&local_158);
                goto LAB_0012dd0f;
              }
              if (local_58 == 0x59583241) {
                this->m_format = PIXEL_FMT_DXN;
                local_178 = 5;
              }
              else {
                this->m_format = PIXEL_FMT_3DC;
                local_178 = 6;
              }
            }
          }
          else if (local_5c < 0x41325445) {
            if (local_5c == 0x33545844) {
LAB_0012dfaa:
              this->m_format = PIXEL_FMT_DXT3;
              local_178 = 2;
            }
            else {
              if ((local_5c != 0x34545844) && (local_5c != 0x35545844)) goto LAB_0012e0c7;
              if ((int)local_58 < 0x52784778) {
                if (local_58 == 0x52424741) {
                  this->m_format = PIXEL_FMT_DXT5_AGBR;
                }
                else if (local_58 == 0x52424778) {
                  this->m_format = PIXEL_FMT_DXT5_xGBR;
                }
                else {
LAB_0012e141:
                  this->m_format = PIXEL_FMT_DXT5;
                }
              }
              else if (local_58 == 0x52784778) {
                this->m_format = PIXEL_FMT_DXT5_xGxR;
              }
              else {
                if (local_58 != 0x59784343) goto LAB_0012e141;
                this->m_format = PIXEL_FMT_DXT5_CCxY;
              }
              local_178 = 3;
            }
          }
          else if (local_5c == 0x41325445) {
            this->m_format = PIXEL_FMT_ETC2A;
            local_178 = 9;
          }
          else if (local_5c == 0x53315445) {
            this->m_format = PIXEL_FMT_ETC1S;
            local_178 = 10;
          }
          else {
            if (local_5c != 0x53413245) goto LAB_0012e0c7;
            this->m_format = PIXEL_FMT_ETC2AS;
            local_178 = 0xb;
          }
          cVar7 = pixel_format_helpers::get_component_flags(this->m_format);
          this->m_comp_flags = cVar7;
          uVar6 = local_58;
          if ((local_60 & 4) != 0) {
            uVar6 = pixel_format_helpers::get_bpp(this->m_format);
          }
          dynamic_string::set(local_168,"Load failed",0xffffffff);
          uVar13 = local_a0;
          if ((local_60 & 4) != 0) {
            uVar13 = (local_a0 + 3 & 0xfffffffc) * (local_a4 + 3 & 0x3ffffffc);
          }
          auStack_16e._2_4_ = 0;
          if ((local_a8 & 0x80008) == 8) {
            auStack_16e._2_4_ = local_9c;
          }
          if (auStack_16e._2_4_ == 0) {
            auStack_16e._2_4_ = uVar13 * uVar6 >> 3;
          }
          else if ((uVar13 * uVar6 & 0xfffffff8) < (uint)auStack_16e._2_4_) {
            pcVar18 = "Invalid pitch";
            goto LAB_0012de58;
          }
          local_158 = (uchar *)0x0;
          uStack_150 = (char *)0x0;
          local_108[1] = 0;
          local_108[0] = 0;
          if (local_54 != 0) {
            local_108[0] = 0;
            uVar19 = local_54;
            do {
              local_108[0] = local_108[0] + 1;
              uVar19 = uVar19 - 1 & uVar19;
            } while (uVar19 != 0);
          }
          if (local_50 != 0) {
            local_108[1] = 0;
            uVar19 = local_50;
            do {
              local_108[1] = local_108[1] + 1;
              uVar19 = uVar19 - 1 & uVar19;
            } while (uVar19 != 0);
          }
          local_108[3] = 0;
          local_108[2] = 0;
          if (local_4c != 0) {
            local_108[2] = 0;
            uVar19 = local_4c;
            do {
              local_108[2] = local_108[2] + 1;
              uVar19 = uVar19 - 1 & uVar19;
            } while (uVar19 != 0);
          }
          if (local_48 != 0) {
            local_108[3] = 0;
            uVar19 = local_48;
            do {
              local_108[3] = local_108[3] + 1;
              uVar19 = uVar19 - 1 & uVar19;
            } while (uVar19 != 0);
          }
          local_d4 = 0;
          local_d8 = 0;
          if ((local_54 & 1) == 0 && local_54 != 0) {
            local_d8 = 0;
            do {
              local_d8 = local_d8 + 1;
              uVar19 = local_54 & 2;
              local_54 = local_54 >> 1;
            } while (uVar19 == 0);
          }
          if ((local_50 & 1) == 0 && local_50 != 0) {
            local_d4 = 0;
            do {
              local_d4 = local_d4 + 1;
              uVar19 = local_50 & 2;
              local_50 = local_50 >> 1;
            } while (uVar19 == 0);
          }
          local_cc = 0;
          local_d0 = 0;
          if ((local_4c & 1) == 0 && local_4c != 0) {
            local_d0 = 0;
            uVar14 = (ulong)local_4c;
            do {
              uVar14 = uVar14 >> 1;
              local_d0 = local_d0 + 1;
              uVar19 = local_4c & 2;
              local_4c = (uint)uVar14;
            } while (uVar19 == 0);
          }
          if ((local_48 & 1) == 0 && local_48 != 0) {
            local_cc = 0;
            do {
              local_cc = local_cc + 1;
              uVar19 = local_48 & 2;
              local_48 = local_48 >> 1;
            } while (uVar19 == 0);
          }
          if ((local_108[0] == 0 && (local_60 >> 0x11 & 1) != 0) &&
             (local_108[0] = local_58 >> 3, (local_60 & 1) != 0)) {
            local_108[0] = local_58 >> 4;
          }
          local_e8 = &this->m_faces;
          vector<crnlib::vector<crnlib::mip_level_*>_>::resize(local_e8,(uint)uVar24,false);
          local_c0 = (ulong)local_15c;
          uVar14 = 0;
          local_13c = 0;
          local_120 = 0;
          uVar19 = auStack_16e._2_4_;
          local_148 = this;
          local_c8 = uVar24;
          do {
            uVar25 = local_15c;
            local_b8 = uVar14 * 0x10;
            uVar16 = local_e8->m_p[uVar14].m_size;
            this_01 = local_e8->m_p + uVar14;
            local_138 = uVar14;
            if (uVar16 != local_15c) {
              if (uVar16 <= local_15c) {
                if (this_01->m_capacity < local_15c) {
                  elemental_vector::increase_capacity
                            ((elemental_vector *)this_01,local_15c,uVar16 + 1 == local_15c,8,
                             (object_mover)0x0,false);
                }
                memset(this_01->m_p + this_01->m_size,0,(ulong)(uVar25 - this_01->m_size) << 3);
              }
              this_01->m_size = local_15c;
            }
            bVar27 = true;
            uVar24 = 0;
            do {
              uVar25 = local_a0 >> ((byte)uVar24 & 0x1f);
              uVar25 = uVar25 + (uVar25 == 0);
              uVar16 = local_a4 >> ((byte)uVar24 & 0x1f);
              local_128 = (ulong)(uVar16 + (uVar16 == 0));
              local_e0 = (mip_level *)crnlib_malloc(0x28);
              local_e0->m_width = 0;
              local_e0->m_height = 0;
              local_e0->m_comp_flags = cDefaultCompFlags;
              *(undefined8 *)&local_e0->m_format = 0;
              *(undefined8 *)((long)&local_e0->m_pImage + 4) = 0;
              *(undefined8 *)((long)&local_e0->m_pDXTImage + 4) = 0;
              *(mip_level **)(*(long *)((long)&local_e8->m_p->m_p + local_b8) + uVar24 * 8) =
                   local_e0;
              if ((local_60 & 4) == 0) {
                local_110 = uVar16;
                piVar9 = (image<crnlib::color_quad<unsigned_char,_int>_> *)crnlib_malloc(0x30);
                _local_170 = 0xff000000;
                image<crnlib::color_quad<unsigned_char,_int>_>::image
                          (piVar9,uVar25,(uint)local_128,0xffffffff,
                           (color_quad<unsigned_char,_int> *)local_170,0xf);
                uVar16 = local_58;
                piVar9->m_comp_flags = this->m_comp_flags;
                uVar17 = local_58 >> 3;
                uVar19 = uVar17 * uVar25;
                if (uVar24 == 0) {
                  uVar19 = auStack_16e._2_4_;
                }
                local_118 = piVar9;
                if ((uint)uStack_150 < uVar19) {
                  if (uStack_150._4_4_ < uVar19) {
                    elemental_vector::increase_capacity
                              ((elemental_vector *)&local_158,uVar19,(uint)uStack_150 + 1 == uVar19,
                               1,(object_mover)0x0,false);
                  }
                  memset(local_158 + ((ulong)uStack_150 & 0xffffffff),0,
                         (ulong)(uVar19 - (uint)uStack_150));
                  uStack_150 = (char *)CONCAT44(uStack_150._4_4_,uVar19);
                }
                _local_170 = 0xff000000;
                uVar26 = 0;
                local_f0 = uVar24;
                do {
                  uVar8 = (*local_130->m_pStream->_vptr_data_stream[4])
                                    (local_130->m_pStream,local_158,(ulong)uVar19);
                  piVar9 = local_118;
                  this = local_148;
                  if (uVar8 != uVar19) {
                    pcVar20 = (local_118->m_pixel_buf).m_p;
                    if (pcVar20 != (color_quad<unsigned_char,_int> *)0x0) {
                      crnlib_free(pcVar20);
                    }
                    crnlib_free(piVar9);
                    this = local_148;
                    goto LAB_0012e775;
                  }
                  pcVar20 = local_118->m_pPixels + local_118->m_pitch * uVar26;
                  uVar8 = 0;
                  uVar24 = 0;
                  do {
                    uVar21 = 0;
                    if (7 < uVar16) {
                      pbVar10 = local_158 + uVar8;
                      uVar14 = 0;
                      uVar21 = 0;
                      do {
                        uVar21 = uVar21 | (uint)*pbVar10 << ((byte)uVar14 & 0x1f);
                        uVar14 = uVar14 + 8;
                        pbVar10 = pbVar10 + 1;
                      } while (uVar17 * 8 != uVar14);
                    }
                    lVar22 = 0;
                    do {
                      if (local_108[lVar22] != 0) {
                        uVar23 = ~(-1 << ((byte)local_108[lVar22] & 0x1f));
                        uVar14 = (ulong)((uVar23 >> 1) +
                                        (uVar21 >> (*(byte *)(&local_d8 + lVar22) & 0x1f) & uVar23)
                                        * 0xff) / (ulong)uVar23;
                        if (0xfe < (int)uVar14) {
                          uVar14 = 0xff;
                        }
                        if ((int)uVar14 < 1) {
                          uVar14 = 0;
                        }
                        local_170[lVar22] = (char)uVar14;
                      }
                      aVar3 = _local_170;
                      lVar22 = lVar22 + 1;
                    } while (lVar22 != 4);
                    if ((local_60 & 0x20000) != 0) {
                      local_170[1] = local_170[0];
                      auStack_16e[1] = aVar3.field_0.a;
                      auStack_16e[0] = local_170[0];
                    }
                    (pcVar20->field_0).field_0.r = local_170[0];
                    (pcVar20->field_0).field_0.g = local_170[1];
                    (pcVar20->field_0).field_0.b = auStack_16e[0];
                    (pcVar20->field_0).field_0.a = auStack_16e[1];
                    pcVar20 = pcVar20 + 1;
                    uVar24 = uVar24 + 1;
                    uVar8 = uVar8 + uVar17;
                  } while (uVar24 != uVar25);
                  uVar26 = uVar26 + 1;
                } while (uVar26 != (uint)local_128);
                mip_level::assign(local_e0,local_118,local_148->m_format,cDefaultOrientationFlags);
                uVar11 = extraout_RAX;
                uVar24 = local_f0;
                uVar19 = auStack_16e._2_4_;
                if (uVar26 < local_110) {
LAB_0012e775:
                  bVar4 = false;
                  uVar12 = 0;
                  uVar24 = local_f0;
                  uVar19 = auStack_16e._2_4_;
                }
                else {
LAB_0012e940:
                  uVar12 = (undefined7)((ulong)uVar11 >> 8);
                  bVar4 = true;
                }
              }
              else {
                pVar1 = this->m_format;
                iVar5 = 8;
                if (0x41315843 < (int)pVar1) {
                  if ((int)pVar1 < 0x52784778) {
                    if ((int)pVar1 < 0x52424741) {
                      if (pVar1 == PIXEL_FMT_DXT1A) goto LAB_0012e839;
                      if (pVar1 == PIXEL_FMT_ETC2A) goto LAB_0012e834;
                    }
                    else if ((pVar1 == PIXEL_FMT_DXT5_AGBR) || (pVar1 == PIXEL_FMT_DXT5_xGBR))
                    goto LAB_0012e834;
                  }
                  else if ((int)pVar1 < 0x53413245) {
                    if (pVar1 == PIXEL_FMT_DXT5_xGxR) goto LAB_0012e834;
                    if (pVar1 == PIXEL_FMT_ETC1S) goto LAB_0012e839;
                  }
                  else if (((pVar1 == PIXEL_FMT_ETC2AS) || (pVar1 == PIXEL_FMT_DXN)) ||
                          (pVar1 == PIXEL_FMT_DXT5_CCxY)) goto LAB_0012e834;
                  goto LAB_0012e830;
                }
                if ((int)pVar1 < 0x32495441) {
                  if ((int)pVar1 < 0x31545844) {
                    if ((pVar1 != PIXEL_FMT_ETC1) && (pVar1 != PIXEL_FMT_DXT5A)) goto LAB_0012e830;
                  }
                  else if ((pVar1 != PIXEL_FMT_DXT1) && (pVar1 != PIXEL_FMT_ETC2))
                  goto LAB_0012e830;
                }
                else {
                  if ((int)pVar1 < 0x33545844) {
                    if ((pVar1 == PIXEL_FMT_3DC) || (pVar1 == PIXEL_FMT_DXT2)) goto LAB_0012e834;
                  }
                  else if ((pVar1 == PIXEL_FMT_DXT3) ||
                          ((pVar1 == PIXEL_FMT_DXT4 || (pVar1 == PIXEL_FMT_DXT5)))) {
LAB_0012e834:
                    iVar5 = 0x10;
                    goto LAB_0012e839;
                  }
LAB_0012e830:
                  iVar5 = 0;
                }
LAB_0012e839:
                uVar25 = ((int)local_128 + 3U >> 2) * (uVar25 + 3 >> 2) * iVar5;
                uVar16 = uVar25;
                if (uVar24 == 0) {
                  uVar16 = uVar19;
                }
                this_00 = (dxt_image *)crnlib_malloc(0x48);
                dxt_image::dxt_image(this_00);
                iVar5 = dxt_image::init(this_00,(EVP_PKEY_CTX *)(ulong)local_178);
                peVar2 = (this_00->m_elements).m_p;
                if ((char)iVar5 == '\0') {
                  if (peVar2 != (element *)0x0) {
                    crnlib_free(peVar2);
                  }
LAB_0012e922:
                  crnlib_free(this_00);
                  bVar4 = false;
                  uVar11 = extraout_RAX_01;
                }
                else {
                  uVar17 = (*local_130->m_pStream->_vptr_data_stream[4])
                                     (local_130->m_pStream,peVar2,(ulong)uVar25);
                  if (uVar17 != uVar25) {
                    peVar2 = (this_00->m_elements).m_p;
                    if (peVar2 != (element *)0x0) {
                      crnlib_free(peVar2);
                    }
                    goto LAB_0012e922;
                  }
                  if ((uVar25 <= uVar16 && uVar16 - uVar25 != 0) &&
                     (iVar5 = (*local_130->m_pStream->_vptr_data_stream[5])(),
                     CONCAT44(extraout_var_00,iVar5) != (ulong)(uVar16 - uVar25))) {
                    peVar2 = (this_00->m_elements).m_p;
                    if (peVar2 != (element *)0x0) {
                      crnlib_free(peVar2);
                    }
                    goto LAB_0012e922;
                  }
                  if ((local_148->m_format == PIXEL_FMT_DXT1) && ((local_120 & 1) == 0)) {
                    bVar4 = dxt_image::has_alpha(this_00);
                    local_120 = CONCAT71(extraout_var,bVar4);
                  }
                  bVar4 = true;
                  mip_level::assign(local_e0,this_00,local_148->m_format,cDefaultOrientationFlags);
                  uVar11 = extraout_RAX_00;
                }
                this = local_148;
                if (bVar4) goto LAB_0012e940;
                bVar4 = false;
                uVar12 = 0;
              }
              if (!bVar4) break;
              uVar24 = uVar24 + 1;
              bVar27 = uVar24 < local_c0;
            } while (uVar24 != local_c0);
            if (bVar27) break;
            uVar14 = local_138 + 1;
            local_13c = (uint)CONCAT71(uVar12,local_c8 <= uVar14);
          } while (uVar14 != local_c8);
          bVar15 = (byte)local_13c;
          if (((local_13c & 1) != 0) && (dynamic_string::clear(local_168), (local_120 & 1) != 0)) {
            change_dxt1_to_dxt1a(this);
          }
          vector<unsigned_char>::~vector((vector<unsigned_char> *)&local_158);
          goto LAB_0012dd11;
        }
        pcVar18 = "Palettized textures unsupported";
      }
      else {
        if ((local_40 >> 9 & 1) != 0) {
          uVar24 = 6;
          if ((local_40 & 0xfc00) != 0xfc00) {
            dynamic_string::set(local_168,"Incomplete cubemaps unsupported",0xffffffff);
            goto LAB_0012dd0f;
          }
          goto LAB_0012ddd9;
        }
        if ((local_40 >> 0x15 & 1) == 0) goto LAB_0012ddd9;
        pcVar18 = "Volume textures unsupported";
      }
LAB_0012de58:
      dynamic_string::set(local_168,pcVar18,0xffffffff);
    }
  }
LAB_0012dd0f:
  bVar15 = 0;
LAB_0012dd11:
  return (bool)(bVar15 & 1);
}

Assistant:

bool mipmapped_texture::read_dds_internal(data_stream_serializer& serializer) {
  CRNLIB_ASSERT(serializer.get_little_endian());

  clear();

  set_last_error("Not a DDS file");

  uint8 hdr[4];
  if (!serializer.read(hdr, sizeof(hdr)))
    return false;

  if (memcmp(hdr, "DDS ", 4) != 0)
    return false;

  DDSURFACEDESC2 desc;
  if (!serializer.read(&desc, sizeof(desc)))
    return false;

  if (!c_crnlib_little_endian_platform)
    utils::endian_switch_dwords(reinterpret_cast<uint32*>(&desc), sizeof(desc) / sizeof(uint32));

  if (desc.dwSize != sizeof(desc))
    return false;

  if ((!desc.dwHeight) || (!desc.dwWidth) || (desc.dwHeight > cDDSMaxImageDimensions) || (desc.dwWidth > cDDSMaxImageDimensions))
    return false;

  m_width = desc.dwWidth;
  m_height = desc.dwHeight;

  uint num_mip_levels = 1;

  if ((desc.dwFlags & DDSD_MIPMAPCOUNT) && (desc.ddsCaps.dwCaps & DDSCAPS_MIPMAP) && (desc.dwMipMapCount)) {
    num_mip_levels = desc.dwMipMapCount;
    if (num_mip_levels > utils::compute_max_mips(desc.dwWidth, desc.dwHeight))
      return false;
  }

  uint num_faces = 1;

  if (desc.ddsCaps.dwCaps & DDSCAPS_COMPLEX) {
    if (desc.ddsCaps.dwCaps2 & DDSCAPS2_CUBEMAP) {
      const uint all_faces_mask = DDSCAPS2_CUBEMAP_POSITIVEX | DDSCAPS2_CUBEMAP_NEGATIVEX | DDSCAPS2_CUBEMAP_POSITIVEY | DDSCAPS2_CUBEMAP_NEGATIVEY | DDSCAPS2_CUBEMAP_POSITIVEZ | DDSCAPS2_CUBEMAP_NEGATIVEZ;
      if ((desc.ddsCaps.dwCaps2 & all_faces_mask) != all_faces_mask) {
        set_last_error("Incomplete cubemaps unsupported");
        return false;
      }

      num_faces = 6;
    } else if (desc.ddsCaps.dwCaps2 & DDSCAPS2_VOLUME) {
      set_last_error("Volume textures unsupported");
      return false;
    }
  }

  if (desc.ddpfPixelFormat.dwFlags & DDPF_PALETTEINDEXED8) {
    // It's difficult to even make P8 textures with existing tools:
    // nvdxt just hangs
    // dxtex.exe just makes all-white textures
    // So screw it.
    set_last_error("Palettized textures unsupported");
    return false;
  }

  dxt_format dxt_fmt = cDXTInvalid;

  if (desc.ddpfPixelFormat.dwFlags & DDPF_FOURCC) {
    // http://code.google.com/p/nvidia-texture-tools/issues/detail?id=41
    // ATI2 YX:            0 (0x00000000)
    // ATI2 XY:   1498952257 (0x59583241) (BC5)
    // ATI Compressonator obeys this stuff, nvidia's tools (like readdxt) don't - oh great

    switch (desc.ddpfPixelFormat.dwFourCC) {
      case PIXEL_FMT_DXT1: {
        m_format = PIXEL_FMT_DXT1;
        dxt_fmt = cDXT1;
        break;
      }
      case PIXEL_FMT_DXT2:
      case PIXEL_FMT_DXT3: {
        m_format = PIXEL_FMT_DXT3;
        dxt_fmt = cDXT3;
        break;
      }
      case PIXEL_FMT_DXT4:
      case PIXEL_FMT_DXT5: {
        switch (desc.ddpfPixelFormat.dwRGBBitCount) {
          case PIXEL_FMT_DXT5_CCxY:
            m_format = PIXEL_FMT_DXT5_CCxY;
            break;
          case PIXEL_FMT_DXT5_xGxR:
            m_format = PIXEL_FMT_DXT5_xGxR;
            break;
          case PIXEL_FMT_DXT5_xGBR:
            m_format = PIXEL_FMT_DXT5_xGBR;
            break;
          case PIXEL_FMT_DXT5_AGBR:
            m_format = PIXEL_FMT_DXT5_AGBR;
            break;
          default:
            m_format = PIXEL_FMT_DXT5;
            break;
        }

        dxt_fmt = cDXT5;
        break;
      }
      case PIXEL_FMT_3DC: {
        if (desc.ddpfPixelFormat.dwRGBBitCount == CRNLIB_PIXEL_FMT_FOURCC('A', '2', 'X', 'Y')) {
          dxt_fmt = cDXN_XY;
          m_format = PIXEL_FMT_DXN;
        } else {
          dxt_fmt = cDXN_YX;  // aka ATI2
          m_format = PIXEL_FMT_3DC;
        }

        break;
      }
      case PIXEL_FMT_DXT5A: {
        m_format = PIXEL_FMT_DXT5A;
        dxt_fmt = cDXT5A;
        break;
      }
      case PIXEL_FMT_ETC1: {
        m_format = PIXEL_FMT_ETC1;
        dxt_fmt = cETC1;
        break;
      }
      case PIXEL_FMT_ETC2: {
        m_format = PIXEL_FMT_ETC2;
        dxt_fmt = cETC2;
        break;
      }
      case PIXEL_FMT_ETC2A: {
        m_format = PIXEL_FMT_ETC2A;
        dxt_fmt = cETC2A;
        break;
      }
      case PIXEL_FMT_ETC1S: {
        m_format = PIXEL_FMT_ETC1S;
        dxt_fmt = cETC1S;
        break;
      }
      case PIXEL_FMT_ETC2AS: {
        m_format = PIXEL_FMT_ETC2AS;
        dxt_fmt = cETC2AS;
        break;
      }
      default: {
        dynamic_string err_msg(cVarArg, "Unsupported DDS FOURCC format: 0x%08X", desc.ddpfPixelFormat.dwFourCC);
        set_last_error(err_msg.get_ptr());
        return false;
      }
    }
  } else if ((desc.ddpfPixelFormat.dwRGBBitCount < 8) || (desc.ddpfPixelFormat.dwRGBBitCount > 32) || (desc.ddpfPixelFormat.dwRGBBitCount & 7)) {
    set_last_error("Unsupported bit count");
    return false;
  } else if (desc.ddpfPixelFormat.dwFlags & DDPF_RGB) {
    if (desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE) {
      if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHAPIXELS)
        m_format = PIXEL_FMT_A8L8;
      else
        m_format = PIXEL_FMT_L8;
    } else if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHAPIXELS)
      m_format = PIXEL_FMT_A8R8G8B8;
    else
      m_format = PIXEL_FMT_R8G8B8;
  } else if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHAPIXELS) {
    if (desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE)
      m_format = PIXEL_FMT_A8L8;
    else
      m_format = PIXEL_FMT_A8;
  } else if (desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE) {
    m_format = PIXEL_FMT_L8;
  } else if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHA) {
    m_format = PIXEL_FMT_A8;
  } else {
    set_last_error("Unsupported format");
    return false;
  }

  m_comp_flags = pixel_format_helpers::get_component_flags(m_format);

  uint bits_per_pixel = desc.ddpfPixelFormat.dwRGBBitCount;

  if (desc.ddpfPixelFormat.dwFlags & DDPF_FOURCC)
    bits_per_pixel = pixel_format_helpers::get_bpp(m_format);

  set_last_error("Load failed");

  uint default_pitch;
  if (desc.ddpfPixelFormat.dwFlags & DDPF_FOURCC)
    default_pitch = (((desc.dwWidth + 3) & ~3) * ((desc.dwHeight + 3) & ~3) * bits_per_pixel) >> 3;
  else
    default_pitch = (desc.dwWidth * bits_per_pixel) >> 3;

  uint pitch = 0;
  if ((desc.dwFlags & DDSD_PITCH) && (!(desc.dwFlags & DDSD_LINEARSIZE))) {
    pitch = desc.lPitch;
  }

  if (!pitch)
    pitch = default_pitch;
#if 0
      else if (pitch & 3)
      {
         // MS's DDS docs say the pitch must be DWORD aligned - but this isn't always the case.
         // ATI Compressonator writes images with non-DWORD aligned pitches, and the DDSWithoutD3DX sample from MS doesn't compute the proper DWORD aligned pitch when reading DDS
         // files, so the docs must be wrong/outdated.
         console::warning("DDS file's pitch is not divisible by 4 - trying to load anyway.");
      }
#endif
  // Check for obviously wacky source pitches (probably a corrupted/invalid file).
  else if (pitch > default_pitch * 8) {
    set_last_error("Invalid pitch");
    return false;
  }

  crnlib::vector<uint8> load_buf;

  uint mask_size[4];
  mask_size[0] = math::bitmask_size(desc.ddpfPixelFormat.dwRBitMask);
  mask_size[1] = math::bitmask_size(desc.ddpfPixelFormat.dwGBitMask);
  mask_size[2] = math::bitmask_size(desc.ddpfPixelFormat.dwBBitMask);
  mask_size[3] = math::bitmask_size(desc.ddpfPixelFormat.dwRGBAlphaBitMask);

  uint mask_ofs[4];
  mask_ofs[0] = math::bitmask_ofs(desc.ddpfPixelFormat.dwRBitMask);
  mask_ofs[1] = math::bitmask_ofs(desc.ddpfPixelFormat.dwGBitMask);
  mask_ofs[2] = math::bitmask_ofs(desc.ddpfPixelFormat.dwBBitMask);
  mask_ofs[3] = math::bitmask_ofs(desc.ddpfPixelFormat.dwRGBAlphaBitMask);

  if ((desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE) && (!mask_size[0])) {
    mask_size[0] = desc.ddpfPixelFormat.dwRGBBitCount >> 3;
    if (desc.ddpfPixelFormat.dwFlags & DDPF_ALPHAPIXELS)
      mask_size[0] /= 2;
  }

  m_faces.resize(num_faces);

  bool dxt1_alpha = false;

  for (uint face_index = 0; face_index < num_faces; face_index++) {
    m_faces[face_index].resize(num_mip_levels);

    for (uint level_index = 0; level_index < num_mip_levels; level_index++) {
      const uint width = math::maximum<uint>(desc.dwWidth >> level_index, 1U);
      const uint height = math::maximum<uint>(desc.dwHeight >> level_index, 1U);

      mip_level* pMip = crnlib_new<mip_level>();
      m_faces[face_index][level_index] = pMip;

      if (desc.ddpfPixelFormat.dwFlags & DDPF_FOURCC) {
        const uint bytes_per_block = pixel_format_helpers::get_dxt_bytes_per_block(m_format);

        const uint num_blocks_x = (width + 3) >> 2;
        const uint num_blocks_y = (height + 3) >> 2;

        const uint actual_level_pitch = num_blocks_x * num_blocks_y * bytes_per_block;
        const uint level_pitch = level_index ? actual_level_pitch : pitch;

        dxt_image* pDXTImage = crnlib_new<dxt_image>();
        if (!pDXTImage->init(dxt_fmt, width, height, false)) {
          crnlib_delete(pDXTImage);

          CRNLIB_ASSERT(0);
          return false;
        }

        CRNLIB_ASSERT(pDXTImage->get_element_vec().size() * sizeof(dxt_image::element) == actual_level_pitch);

        if (!serializer.read(&pDXTImage->get_element_vec()[0], actual_level_pitch)) {
          crnlib_delete(pDXTImage);

          return false;
        }

        // DDS image in memory are always assumed to be little endian - the same as DDS itself.
        //if (c_crnlib_big_endian_platform)
        //   utils::endian_switch_words(reinterpret_cast<uint16*>(&pDXTImage->get_element_vec()[0]), actual_level_pitch / sizeof(uint16));

        if (level_pitch > actual_level_pitch) {
          if (!serializer.skip(level_pitch - actual_level_pitch)) {
            crnlib_delete(pDXTImage);

            return false;
          }
        }

        if ((m_format == PIXEL_FMT_DXT1) && (!dxt1_alpha))
          dxt1_alpha = pDXTImage->has_alpha();

        pMip->assign(pDXTImage, m_format);
      } else {
        image_u8* pImage = crnlib_new<image_u8>(width, height);

        pImage->set_comp_flags(m_comp_flags);

        const uint bytes_per_pixel = desc.ddpfPixelFormat.dwRGBBitCount >> 3;
        const uint actual_line_pitch = width * bytes_per_pixel;
        const uint line_pitch = level_index ? actual_line_pitch : pitch;

        if (load_buf.size() < line_pitch)
          load_buf.resize(line_pitch);

        color_quad_u8 q(0, 0, 0, 255);

        for (uint y = 0; y < height; y++) {
          if (!serializer.read(&load_buf[0], line_pitch)) {
            crnlib_delete(pImage);
            return false;
          }

          color_quad_u8* pDst = pImage->get_scanline(y);

          for (uint x = 0; x < width; x++) {
            const uint8* pPixel = &load_buf[x * bytes_per_pixel];

            uint c = 0;
            // Assumes DDS is always little endian.
            for (uint l = 0; l < bytes_per_pixel; l++)
              c |= (pPixel[l] << (l * 8U));

            for (uint i = 0; i < 4; i++) {
              if (!mask_size[i])
                continue;

              uint mask = (1U << mask_size[i]) - 1U;
              uint bits = (c >> mask_ofs[i]) & mask;

              uint v = (bits * 255 + (mask >> 1)) / mask;

              q.set_component(i, v);
            }

            if (desc.ddpfPixelFormat.dwFlags & DDPF_LUMINANCE) {
              q.g = q.r;
              q.b = q.r;
            }

            *pDst++ = q;
          }
        }

        pMip->assign(pImage, m_format);

        CRNLIB_ASSERT(pMip->get_comp_flags() == m_comp_flags);
      }
    }
  }

  clear_last_error();

  if (dxt1_alpha)
    change_dxt1_to_dxt1a();

  return true;
}